

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O3

void Centaurus::LDFARoutineEM64T<wchar_t>::emit_state
               (X86Assembler *as,Label *rejectlabel,LDFAState<wchar_t> *state,
               vector<asmjit::Label,_std::allocator<asmjit::Label>_> *labels,
               vector<asmjit::Label,_std::allocator<asmjit::Label>_> *exitlabels)

{
  wchar_t o1;
  uint uVar1;
  pointer pNVar2;
  pointer pRVar3;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> *pvVar4;
  Operand_ *o0;
  Range<wchar_t> *r;
  pointer pRVar5;
  NFATransition<wchar_t> *tr;
  pointer pNVar6;
  anon_union_16_7_ed616b9d_for_Operand__0 local_40;
  
  local_40._packed[0] = (UInt64)1.65781168201985e-316;
  local_40._any.reserved12_4 = 3;
  local_40._any.reserved8_4 = 0;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x1ad,(Operand_ *)(asmjit::x86OpData + 0x480),
             (Operand_ *)&local_40._any);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x490),
             (Operand_ *)(asmjit::x86OpData + 0x480));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,7,(Operand_ *)(asmjit::x86OpData + 0x4b0),2);
  pNVar2 = (state->
           super_NFABaseState<wchar_t,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
           ).m_transitions.
           super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pNVar6 = (state->
                super_NFABaseState<wchar_t,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
                ).m_transitions.
                super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pNVar6 != pNVar2; pNVar6 = pNVar6 + 1) {
    pRVar3 = (pNVar6->m_label).m_ranges.
             super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pRVar5 = (pNVar6->m_label).m_ranges.
                  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pRVar5 != pRVar3; pRVar5 = pRVar5 + 1)
    {
      o1 = pRVar5->m_start;
      if (o1 + L'\x01' == pRVar5->m_end) {
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x67,(Operand_ *)(asmjit::x86OpData + 0x480),o1)
        ;
        uVar1 = pNVar6->m_dest;
        if ((long)(int)uVar1 < 0) {
          o0 = (Operand_ *)
               ((exitlabels->super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>).
                _M_impl.super__Vector_impl_data._M_start + ~uVar1);
        }
        else {
          o0 = (Operand_ *)
               ((labels->super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>)._M_impl.
                super__Vector_impl_data._M_start + (int)uVar1);
        }
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x118,o0);
      }
      else {
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x2c4,(Operand_ *)(asmjit::x86OpData + 0x480),o1);
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x67,(Operand_ *)(asmjit::x86OpData + 0x480),
                   pRVar5->m_end - pRVar5->m_start);
        uVar1 = pNVar6->m_dest;
        pvVar4 = labels;
        if ((int)uVar1 < 0) {
          pvVar4 = exitlabels;
        }
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x115,
                   (Operand_ *)
                   ((pvVar4->super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>).
                    _M_impl.super__Vector_impl_data._M_start + ((int)uVar1 >> 0x1f ^ uVar1)));
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x480),
                   (Operand_ *)(asmjit::x86OpData + 0x490));
      }
    }
  }
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x11e,(Operand_ *)rejectlabel);
  return;
}

Assistant:

void LDFARoutineEM64T<TCHAR>::emit_state(asmjit::X86Assembler& as, asmjit::Label& rejectlabel, const LDFAState<TCHAR>& state, std::vector<asmjit::Label>& labels, std::vector<asmjit::Label>& exitlabels)
{
    if (sizeof(TCHAR) == 1)
        as.movzx(CHAR_REG, asmjit::x86::byte_ptr(PEEK_REG, 0));
    else
        as.movzx(CHAR_REG, asmjit::x86::word_ptr(PEEK_REG, 0));
    as.mov(CHAR2_REG, CHAR_REG);
    if (sizeof(TCHAR) == 1)
        as.inc(PEEK_REG);
    else
        as.add(PEEK_REG, 2);

    for (const auto& tr : state.get_transitions())
    {
        for (const auto& r : tr.label())
        {
            if (r.start() + 1 == r.end())
            {
                as.cmp(CHAR_REG, r.start());
                if (tr.dest() >= 0)
                {
                    as.je(labels[tr.dest()]);
                }
                else
                {
                    as.je(exitlabels[-tr.dest() - 1]);
                }
            }
            else
            {
                as.sub(CHAR_REG, r.start());
                as.cmp(CHAR_REG, r.end() - r.start());
                if (tr.dest() >= 0)
                {
                    as.jb(labels[tr.dest()]);
                }
                else
                {
                    as.jb(exitlabels[-tr.dest() - 1]);
                }
                as.mov(CHAR_REG, CHAR2_REG);
            }
        }
    }
    as.jmp(rejectlabel);
}